

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O1

void __thiscall Lodtalk::StackFrame::updateMarriedSpouseState(StackFrame *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  
  if (this->framePointer[-0xe] == '\0') {
    __assert_fail("hasContext()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0x77,"void Lodtalk::StackFrame::updateMarriedSpouseState()");
  }
  puVar3 = *(undefined8 **)(this->framePointer + -0x18);
  if (puVar3 != &NilObject) {
    puVar3[3] = this->stackPointer + 1;
    puVar1 = this->stackPointer;
    puVar2 = this->framePointer + -0x28;
    if (puVar1 <= puVar2) {
      puVar3 = puVar3 + (ulong)this->framePointer[-0x10] + 8;
      do {
        *puVar3 = *(undefined8 *)puVar2;
        puVar2 = puVar2 + -8;
        puVar3 = puVar3 + 1;
      } while (puVar1 <= puVar2);
    }
    return;
  }
  __assert_fail("!isNil(context)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x79,"void Lodtalk::StackFrame::updateMarriedSpouseState()");
}

Assistant:

void StackFrame::updateMarriedSpouseState()
{
    assert(hasContext());
    auto context = reinterpret_cast<Context*> (getThisContext().pointer);
    assert(!isNil(context));
    context->stackp = Oop::fromPointer(stackPointer + 1);

    // Copy the temporaries back to the context.
    auto currentTemporary = reinterpret_cast<Oop*> (framePointer + InterpreterStackFrame::FirstTempOffset);
    auto temporaryEnd = reinterpret_cast<Oop*> (stackPointer);
    auto currentTempIndex = getArgumentCount();
    for (;  currentTemporary >= temporaryEnd; --currentTemporary, currentTempIndex++)
        context->data[currentTempIndex] = *currentTemporary;
}